

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O2

void Js::JavascriptLibrary::AddWeakSetElementInflate_TTD(JavascriptWeakSet *set,Var value)

{
  BaseHashSet<Js::RecyclableObject_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::RecyclableObject_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  *this;
  DynamicObject *key;
  DynamicObject *local_28;
  
  this = Memory::
         RecyclerRootPtr<JsUtil::BaseHashSet<Js::RecyclableObject_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::RecyclableObject_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
         ::operator->(&((((((set->super_DynamicObject).super_RecyclableObject.type.ptr)->
                          javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr)->
                       TTDContextInfo->TTDWeakReferencePinSet);
  local_28 = VarTo<Js::DynamicObject>(value);
  JsUtil::
  BaseHashSet<Js::RecyclableObject_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::RecyclableObject_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  ::Add(this,(RecyclableObject **)&local_28);
  key = VarTo<Js::DynamicObject>(value);
  JavascriptWeakSet::Add(set,&key->super_RecyclableObject);
  return;
}

Assistant:

void JavascriptLibrary::AddWeakSetElementInflate_TTD(Js::JavascriptWeakSet* set, Var value)
    {
        set->GetScriptContext()->TTDContextInfo->TTDWeakReferencePinSet->Add(Js::VarTo<Js::DynamicObject>(value));

        set->Add(Js::VarTo<Js::DynamicObject>(value));
    }